

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test::
TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test
          (TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test *this)

{
  TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test *this_local;
  
  memset(this,0,0x30);
  TEST_GROUP_CppUTestGroupMockExpectedCallsList::TEST_GROUP_CppUTestGroupMockExpectedCallsList
            (&this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList);
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test_0032a308;
  return;
}

Assistant:

TEST(MockExpectedCallsList, callToStringForFulfilledFunctions)
{
    call1->withName("foo");
    call2->withName("bar");

    call2->callWasMade(1);
    call1->callWasMade(2);

    list->addExpectedCall(call1);
    list->addExpectedCall(call2);

    SimpleString expectedString;
    expectedString = StringFromFormat("%s\n%s", call1->callToString().asCharString(), call2->callToString().asCharString());
    STRCMP_EQUAL(expectedString.asCharString(), list->fulfilledCallsToString().asCharString());
}